

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O3

void __thiscall layer::Convolution2D::backPropagate(Convolution2D *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  tensor ppplVar11;
  tensor *pppplVar12;
  _func_int *p_Var13;
  undefined1 auVar14 [16];
  longdouble *plVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  Convolution2D *pCVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 Var26;
  undefined6 in_stack_ffffffffffffff72;
  ulong local_78;
  
  uVar1 = (this->super_Layer)._sizeZWeight;
  iVar2 = this->_sizeYIn;
  uVar20 = uVar1 * iVar2 * iVar2;
  if (0 < (int)uVar20) {
    plVar15 = **(this->super_Layer)._deltaIn;
    lVar17 = 0;
    do {
      *(longdouble *)((long)plVar15 + lVar17) = (longdouble)0;
      lVar17 = lVar17 + 0x10;
      in_ST6 = in_ST5;
    } while ((ulong)uVar20 << 4 != lVar17);
  }
  lVar17 = (long)(this->super_Layer)._sizeZOut;
  pCVar19 = this;
  if (0 < lVar17) {
    uVar3 = (this->super_Layer)._sizeXOut;
    uVar4 = (this->super_Layer)._sizeYOut;
    lVar21 = 0;
    do {
      if (0 < (int)uVar4) {
        local_78 = 0;
        do {
          if (0 < (int)uVar3) {
            iVar5 = this->_stepY;
            iVar6 = this->_zeroPaddingY;
            uVar7 = (this->super_Layer)._sizeYWeight;
            uVar25 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar23 = 0;
                do {
                  if (0 < (int)uVar7) {
                    iVar8 = this->_stepX;
                    iVar9 = this->_zeroPaddingX;
                    uVar10 = (this->super_Layer)._sizeXWeight;
                    uVar18 = 0;
                    uVar22 = iVar5 * (int)local_78 - iVar6;
                    do {
                      pCVar19 = (Convolution2D *)
                                CONCAT71((int7)((ulong)pCVar19 >> 8),
                                         ((int)uVar22 < 0 || (int)uVar10 < 1) ||
                                         iVar2 <= (int)uVar22);
                      if (((int)uVar22 >= 0 && (int)uVar10 >= 1) && iVar2 > (int)uVar22) {
                        pCVar19 = (Convolution2D *)(this->super_Layer)._deltaIn;
                        ppplVar11 = (this->super_Layer)._delta;
                        pppplVar12 = (this->super_Layer)._ptrWeight;
                        lVar16 = 0;
                        uVar24 = iVar8 * (int)uVar25 - iVar9;
                        do {
                          if ((int)uVar24 < iVar2 && -1 < (int)uVar24) {
                            p_Var13 = (&(pCVar19->super_Layer)._vptr_Layer)[uVar23][uVar22];
                            *(longdouble *)(p_Var13 + (ulong)uVar24 * 0x10) =
                                 *(longdouble *)(p_Var13 + (ulong)uVar24 * 0x10) +
                                 *(longdouble *)((long)pppplVar12[lVar21][uVar23][uVar18] + lVar16)
                                 * ppplVar11[lVar21][local_78][uVar25];
                            in_ST6 = in_ST5;
                          }
                          uVar24 = uVar24 + 1;
                          lVar16 = lVar16 + 0x10;
                        } while ((ulong)uVar10 << 4 != lVar16);
                      }
                      uVar22 = uVar22 + 1;
                      uVar18 = uVar18 + 1;
                    } while (uVar18 != uVar7);
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar1);
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != uVar3);
          }
          local_78 = local_78 + 1;
        } while (local_78 != uVar4);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar17);
  }
  if (0 < (int)uVar20) {
    plVar15 = **(this->super_Layer)._deltaIn;
    lVar17 = 0;
    lVar21 = 0;
    do {
      auVar14._10_6_ = in_stack_ffffffffffffff72;
      auVar14._0_10_ = *(unkbyte10 *)((long)plVar15 + lVar17);
      Var26 = in_ST6;
      (*(this->super_Layer)._fDerivative)((scalar *)pCVar19,(scalar)auVar14);
      plVar15 = **(this->super_Layer)._deltaIn;
      *(unkbyte10 *)((long)plVar15 + lVar17) = in_ST0;
      lVar21 = lVar21 + 1;
      lVar17 = lVar17 + 0x10;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = Var26;
    } while (lVar21 < (this->super_Layer)._sizeZWeight * this->_sizeYIn * this->_sizeYIn);
  }
  return;
}

Assistant:

void Convolution2D::backPropagate()
    {
        int posXIn = 0;
        int posYIn = 0;

        for(int i(0); i < _sizeZWeight * _sizeYIn * _sizeYIn; i++)
            (**_deltaIn)[i] = 0;

        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _deltaIn[posZKernel][posYIn][posXIn] +=
                                                _delta[posZOut][posYOut][posXOut] *
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                }
            }
        }


        for(int i(0); i < _sizeZWeight * _sizeYIn * _sizeYIn; i++)
            (**_deltaIn)[i] = _fDerivative((**_deltaIn)[i]);
    }